

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int wally_aes(uchar *key,size_t key_len,uchar *bytes,size_t bytes_len,uint32_t flags,
             uchar *bytes_out,size_t len)

{
  _Bool _Var1;
  undefined1 local_130 [8];
  AES256_ctx ctx;
  uchar *bytes_out_local;
  uint32_t flags_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  size_t key_len_local;
  uchar *key_local;
  
  ctx.rk[0xe].slice._8_8_ = bytes_out;
  _Var1 = are_valid_args(key,key_len,bytes,bytes_len,flags);
  if ((((_Var1) && ((len & 0xf) == 0)) && (bytes_len != 0)) &&
     ((((bytes_len & 0xf) == 0 && ((flags & 0xfffffffc) == 0)) &&
      ((ctx.rk[0xe].slice._8_8_ != 0 && (len != 0)))))) {
    if ((flags & 1) == 0) {
      aes_dec((AES256_ctx *)local_130,key,key_len,bytes,bytes_len,(uchar *)ctx.rk[0xe].slice._8_8_);
    }
    else {
      aes_enc((AES256_ctx *)local_130,key,key_len,bytes,bytes_len,(uchar *)ctx.rk[0xe].slice._8_8_);
    }
    wally_clear(local_130,0xf0);
    key_local._4_4_ = 0;
  }
  else {
    key_local._4_4_ = -2;
  }
  return key_local._4_4_;
}

Assistant:

int wally_aes(const unsigned char *key, size_t key_len,
              const unsigned char *bytes, size_t bytes_len,
              uint32_t flags,
              unsigned char *bytes_out, size_t len)
{
    AES256_ctx ctx;

    if (!are_valid_args(key, key_len, bytes, bytes_len, flags) ||
        len % AES_BLOCK_LEN || !bytes_len || bytes_len % AES_BLOCK_LEN ||
        flags & ~ALL_OPS || !bytes_out || !len)
        return WALLY_EINVAL;

    if (flags & AES_FLAG_ENCRYPT)
        aes_enc(&ctx, key, key_len, bytes, bytes_len, bytes_out);
    else
        aes_dec(&ctx, key, key_len, bytes, bytes_len, bytes_out);

    wally_clear(&ctx, sizeof(ctx));
    return WALLY_OK;
}